

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBlock.h
# Opt level: O0

void __thiscall dg::BBlock<dg::LLVMNode>::removeSuccessors(BBlock<dg::LLVMNode> *this)

{
  bool bVar1;
  DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U> *in_RDI;
  BBlockEdge *succ;
  iterator __end0;
  iterator __begin0;
  SuccContainerT *__range2;
  BBlock<dg::LLVMNode> *in_stack_ffffffffffffffc8;
  _Self local_20;
  _Self local_18;
  size_t *local_10;
  
  local_10 = &(in_RDI->container)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_18._M_node =
       (_Base_ptr)
       DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::begin
                 ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)in_stack_ffffffffffffffc8
                 );
  local_20._M_node =
       (_Base_ptr)
       DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::end
                 ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)in_stack_ffffffffffffffc8
                 );
  while( true ) {
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge>::operator*
              ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge> *)0x1cfae9);
    DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>::erase(in_RDI,in_stack_ffffffffffffffc8);
    std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge>::operator++
              ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge> *)in_RDI);
  }
  DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::clear
            ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)0x1cfb1e);
  return;
}

Assistant:

void removeSuccessors() {
        // remove references to this node from successors
        for (const BBlockEdge &succ : nextBBs) {
            // This assertion does not hold anymore, since if we have
            // two edges with different labels to the same successor,
            // and we remove the successor, then we remove 'this'
            // from prevBBs twice. If we'll add labels even to predecessors,
            // this assertion must hold again
            // bool ret = succ.target->prevBBs.erase(this);
            // assert(ret && "Did not have this BB in successor's pred");
            succ.target->prevBBs.erase(this);
        }

        nextBBs.clear();
    }